

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.c
# Opt level: O3

int cmdParse(char *buf,uintptr_t *p,uint ext_len,char *ext,cmdCtlParse_t *ctl)

{
  uintptr_t *val;
  char cVar1;
  undefined1 auVar2 [16];
  int iVar3;
  int iVar4;
  int iVar5;
  __int32_t **pp_Var6;
  void *pvVar7;
  size_t sVar8;
  undefined1 *puVar9;
  uint uVar10;
  ulong uVar11;
  bool bVar12;
  int i;
  long lVar13;
  int *piVar14;
  char *pcVar15;
  uintptr_t uVar16;
  uintptr_t *puVar17;
  int n;
  int8_t to3;
  char c;
  uintptr_t tp1;
  int8_t to5;
  int8_t to4;
  uintptr_t tp3;
  uintptr_t tp2;
  uintptr_t tp5;
  uintptr_t tp4;
  int pp;
  int local_9c;
  char local_95;
  int local_94;
  uintptr_t local_90;
  uintptr_t *local_88;
  int *local_80;
  uintptr_t *local_78;
  char local_6a;
  char local_69;
  char *local_68;
  uintptr_t local_60;
  uintptr_t local_58;
  uintptr_t local_50;
  uintptr_t local_48;
  int8_t *local_40;
  int local_34;
  
  local_90 = 0;
  local_58 = 0;
  local_60 = 0;
  local_48 = 0;
  local_50 = 0;
  if (ext_len < 0x800) {
    return -3;
  }
  ctl->opt[0] = '\0';
  ctl->opt[1] = '\0';
  ctl->opt[2] = '\0';
  ctl->opt[3] = '\0';
  lVar13 = 0;
  local_80 = (int *)ext;
  local_68 = buf;
  __isoc99_sscanf(buf + ctl->eaten," %31s %n",intCmdStr,&local_34);
  uVar11 = (long)ctl->eaten + (long)local_34;
  iVar4 = (int)uVar11;
  ctl->eaten = iVar4;
  *p = 0xffffffffffffffff;
  piVar14 = &cmdInfo[0].vt;
  while (iVar3 = strcasecmp(intCmdStr,*(char **)(piVar14 + -2)), pcVar15 = local_68, iVar3 != 0) {
    lVar13 = lVar13 + 1;
    piVar14 = piVar14 + 8;
    if (lVar13 == 0xa8) {
      intCmdIdx = -1;
      return -1;
    }
  }
  iVar3 = (int)lVar13;
  intCmdIdx = iVar3;
  *p = (long)((cmdInfo_t *)(piVar14 + -4))->cmd;
  puVar17 = p + 1;
  val = p + 2;
  p[1] = 0;
  p[2] = 0;
  p[3] = 0;
  local_88 = val;
  switch(*piVar14) {
  case 0x65:
    break;
  case 0x66:
  case 0x67:
  case 0x68:
  case 0x69:
  case 0x6a:
  case 0x6b:
  case 0x6c:
  case 0x6d:
  case 0x6e:
  case 0x75:
  case 0x76:
  case 0x77:
  case 0x78:
  case 0x81:
  case 0x82:
    return -2;
  case 0x6f:
    iVar4 = getNum(local_68 + uVar11,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar4;
    cVar1 = ctl->opt[1];
    goto joined_r0x001082a6;
  case 0x70:
    lVar13 = (long)iVar4;
    goto LAB_0010832c;
  case 0x71:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    uVar11 = *puVar17;
    goto joined_r0x0010841e;
  case 0x72:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] != '\x01') {
      return -2;
    }
    break;
  case 0x73:
    pcVar15 = local_68 + iVar4;
    sVar8 = strlen(pcVar15);
    p[3] = sVar8;
    memcpy(local_80,pcVar15,sVar8);
    local_94 = (int)p[3];
    goto LAB_00108488;
  case 0x74:
    iVar4 = __isoc99_sscanf(local_68 + iVar4," %*s%n %n",&local_9c,&local_94);
    if (local_9c == 0 || iVar4 < 0) {
      return -2;
    }
    p[3] = (long)local_9c;
    ctl->opt[3] = '\x01';
    memcpy(local_80,local_68 + ctl->eaten,(long)local_9c);
LAB_00108488:
    ctl->eaten = ctl->eaten + local_94;
    break;
  case 0x79:
    local_78 = puVar17;
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*local_78 & 0x80000000) != 0) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    iVar4 = (int)*val;
    goto LAB_00108342;
  case 0x7a:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,local_88,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
      return -2;
    }
    goto LAB_001082a2;
  case 0x7b:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,local_88,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *puVar17) {
      return -2;
    }
LAB_001082a2:
    cVar1 = ctl->opt[2];
joined_r0x001082a6:
    if (cVar1 < '\x01') {
      return -2;
    }
    break;
  case 0x7c:
    local_78 = puVar17;
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,val,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (0x95 < *local_78) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    uVar11 = *val;
joined_r0x0010841e:
    if (0x95 < uVar11) {
      return -2;
    }
    break;
  case 0x7d:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = __isoc99_sscanf(pcVar15 + lVar13," %c %n",&local_94,&local_9c);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar4 < 1) {
      return -2;
    }
    if ((*puVar17 & 0x80000000) != 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + local_9c;
    pp_Var6 = __ctype_toupper_loc();
    pvVar7 = memchr("RW540123",(*pp_Var6)[(char)local_94],9);
    if (pvVar7 == (void *)0x0) {
      return -2;
    }
    iVar4 = 0x10abde;
    goto LAB_001080e2;
  case 0x7e:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = __isoc99_sscanf(pcVar15 + lVar13," %c %n",&local_94,&local_9c);
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if (iVar4 < 1) {
      return -2;
    }
    if ((*puVar17 & 0x80000000) != 0) {
      return -2;
    }
    ctl->eaten = ctl->eaten + local_9c;
    pp_Var6 = __ctype_toupper_loc();
    pvVar7 = memchr("ODU",(*pp_Var6)[(char)local_94],4);
    if (pvVar7 == (void *)0x0) {
      return -2;
    }
    iVar4 = 0x10abe7;
LAB_001080e2:
    *local_88 = (long)((int)pvVar7 - iVar4);
    break;
  case 0x7f:
    local_78 = puVar17;
    iVar4 = __isoc99_sscanf(local_68 + iVar4," %*s%n %n",&local_9c,&local_94);
    if (local_9c == 0 || iVar4 < 0) {
      return -2;
    }
    p[3] = (long)local_9c;
    ctl->opt[2] = '\x01';
    memcpy(local_80,pcVar15 + ctl->eaten,(long)local_9c);
    lVar13 = (long)ctl->eaten + (long)local_94;
    ctl->eaten = (int)lVar13;
    puVar17 = local_78;
LAB_0010832c:
    iVar4 = getNum(pcVar15 + lVar13,puVar17,ctl->opt + 1);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    iVar4 = (int)*puVar17;
    goto LAB_00108342;
  case 0x80:
    iVar4 = __isoc99_sscanf(local_68 + iVar4," %*s%n %n",&local_9c,&local_94);
    pcVar15 = local_68;
    if (local_9c == 0 || iVar4 < 0) {
      return -2;
    }
    sVar8 = (size_t)local_9c;
    p[1] = sVar8;
    memcpy(local_80,local_68 + ctl->eaten,sVar8);
    ctl->eaten = ctl->eaten + local_9c;
    puVar9 = (undefined1 *)(sVar8 + (long)local_80);
    *puVar9 = 0;
    iVar4 = ctl->eaten;
    sVar8 = strlen(pcVar15 + (long)iVar4 + 1);
    iVar5 = (int)sVar8;
    memcpy(puVar9 + 1,pcVar15 + (long)iVar4 + 1,(long)iVar5);
    ctl->eaten = ctl->eaten + iVar5 + 1;
    uVar11 = p[1] + (long)iVar5 + 1;
LAB_00107fe9:
    p[3] = uVar11;
    break;
  case 0x83:
    local_78 = puVar17;
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    local_40 = ctl->opt + 2;
    iVar4 = getNum(pcVar15 + lVar13,val,local_40);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_90,ctl->opt + 3);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*local_78 & 0x80000000) != 0) {
      return -2;
    }
    if (*local_40 < '\x01') {
      return -2;
    }
    if ((*local_88 & 0x80000000) != 0) {
      return -2;
    }
    iVar4 = (int)local_90;
    bVar12 = -1 < iVar4 && '\0' < ctl->opt[3];
    goto LAB_0010819f;
  case 0x84:
    local_78 = puVar17;
    iVar4 = __isoc99_sscanf(local_68 + iVar4," %*s%n %n",&local_9c,&local_94);
    if (local_9c == 0 || iVar4 < 0) {
      return -2;
    }
    p[3] = (long)local_9c;
    ctl->opt[2] = '\x01';
    memcpy(local_80,pcVar15 + ctl->eaten,(long)local_9c);
    puVar17 = local_78;
    lVar13 = (long)ctl->eaten + (long)local_94;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,local_78,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,local_88,ctl->opt + 2);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*puVar17 & 0x80000000) != 0) {
      return -2;
    }
    if (ctl->opt[2] < '\x01') {
      return -2;
    }
    iVar4 = (int)*local_88;
LAB_00108342:
    if (iVar4 < 0) {
      return -2;
    }
    break;
  case 0x85:
    local_78 = puVar17;
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,local_88,ctl->opt + 2);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_90,(int8_t *)&local_9c);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*local_78 & 0x80000000) != 0) {
      return -2;
    }
    iVar4 = (int)local_90;
    bVar12 = (-1 < iVar4 && (char)local_9c == '\x01') && '\0' < ctl->opt[2];
LAB_0010819f:
    if (!bVar12) {
      return -2;
    }
    p[3] = 4;
    *local_80 = iVar4;
    break;
  case 0x86:
    iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_90,(int8_t *)&local_9c);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_58,(int8_t *)&local_94);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_60,&local_95);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_48,&local_69);
    lVar13 = (long)iVar4 + (long)ctl->eaten;
    ctl->eaten = (int)lVar13;
    iVar4 = getNum(pcVar15 + lVar13,&local_50,&local_6a);
    ctl->eaten = ctl->eaten + iVar4;
    if (ctl->opt[1] < '\x01') {
      return -2;
    }
    if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
      return -2;
    }
    if ((char)local_9c != '\x01') {
      return -2;
    }
    if ((local_90 & 0x80000000) != 0) {
      return -2;
    }
    if ((char)local_94 != '\x01') {
      return -2;
    }
    if ((local_58 & 0x80000000) != 0) {
      return -2;
    }
    if (local_95 != '\x01') {
      return -2;
    }
    if ((local_60 & 0x80000000) != 0) {
      return -2;
    }
    if (local_69 != '\x01') {
      return -2;
    }
    if ((local_48 & 0x80000000) != 0) {
      return -2;
    }
    if (local_6a != '\x01') {
      return -2;
    }
    p[3] = 0x14;
    *local_80 = (int)local_90;
    local_80[1] = (int)local_58;
    local_80[2] = (int)local_60;
    local_80[3] = (int)local_48;
    local_80[4] = (int)local_50;
    break;
  default:
    switch(*piVar14) {
    case 0xbf:
      iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
      ctl->eaten = ctl->eaten + iVar4;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
        return -2;
      }
      lVar13 = 0;
      do {
        iVar4 = getNum(local_68 + ctl->eaten,&local_90,(int8_t *)&local_9c);
        ctl->eaten = ctl->eaten + iVar4;
        if ((char)local_9c != '\x01') goto LAB_00107bbb;
        local_80[lVar13] = (int)local_90;
        lVar13 = lVar13 + 1;
      } while ((int)lVar13 != 10);
      lVar13 = 10;
LAB_00107bbb:
      p[3] = (ulong)(uint)((int)lVar13 << 2);
      break;
    case 0xc0:
      uVar11 = 0;
      uVar16 = 0;
      while( true ) {
        iVar4 = getNum(local_68 + ctl->eaten,&local_90,(int8_t *)&local_9c);
        ctl->eaten = ctl->eaten + iVar4;
        if ((char)local_9c != '\x01') break;
        *(int *)((long)local_80 + uVar16) = (int)local_90;
        uVar16 = uVar16 + 4;
        uVar11 = uVar11 + 1;
        if ((int)uVar16 == 0x800) {
          p[3] = 0x800;
          return -2;
        }
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uVar11;
      p[3] = uVar16;
      if ((SUB164(auVar2 * ZEXT816(0xaaaaaaaaaaaaaaab),8) * 2 & 0xfffffffcU) * 3 != (int)uVar16 ||
          (int)uVar16 == 0) {
        return -2;
      }
      break;
    case 0xc1:
      iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
      iVar4 = iVar4 + ctl->eaten;
      ctl->eaten = iVar4;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
        return -2;
      }
      uVar16 = 0;
      do {
        iVar4 = getNum(local_68 + iVar4,&local_90,(int8_t *)&local_9c);
        if (((char)local_9c != '\x01') || ((local_90 & 0xffffff00) != 0)) {
          p[3] = uVar16;
          if ((int)uVar16 != 0) {
            return iVar3;
          }
          if (*p == 0x72) {
            return iVar3;
          }
          return -2;
        }
        *(char *)((long)local_80 + uVar16) = (char)local_90;
        iVar4 = iVar4 + ctl->eaten;
        ctl->eaten = iVar4;
        uVar16 = uVar16 + 1;
      } while ((int)uVar16 != 0x200);
      goto LAB_001088be;
    case 0xc2:
      local_78 = puVar17;
      iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
      lVar13 = (long)iVar4 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar4 = getNum(pcVar15 + lVar13,val,ctl->opt + 2);
      iVar4 = iVar4 + ctl->eaten;
      ctl->eaten = iVar4;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((*local_78 & 0x80000000) != 0) {
        return -2;
      }
      if ((*local_88 & 0xffffff00) != 0) {
        return -2;
      }
      uVar16 = 0;
      do {
        iVar4 = getNum(local_68 + iVar4,&local_90,(int8_t *)&local_9c);
        if (((char)local_9c != '\x01') || ((local_90 & 0xffffff00) != 0)) {
LAB_001088c8:
          p[3] = uVar16;
          if ((int)uVar16 != 0) {
            return iVar3;
          }
          return -2;
        }
        *(char *)((long)local_80 + uVar16) = (char)local_90;
        iVar4 = iVar4 + ctl->eaten;
        ctl->eaten = iVar4;
        uVar16 = uVar16 + 1;
      } while ((int)uVar16 != 0x20);
      p[3] = 0x20;
      break;
    case 0xc3:
      iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
      puVar17 = local_88;
      lVar13 = (long)iVar4 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      if (ctl->opt[1] != '\x01') {
        return iVar3;
      }
      if ((*(byte *)((long)p + 0xb) & 0x80) != 0) {
        return -2;
      }
      iVar4 = getNum(pcVar15 + lVar13,local_88,ctl->opt + 2);
      iVar4 = iVar4 + ctl->eaten;
      ctl->eaten = iVar4;
      if (ctl->opt[2] != '\x01') {
        return iVar3;
      }
      if ((*puVar17 & 0x80000000) != 0) {
        return -2;
      }
      uVar11 = 0;
      do {
        iVar4 = getNum(local_68 + iVar4,&local_90,(int8_t *)&local_9c);
        if (((char)local_9c != '\x01') || ((local_90 & 0xffffff00) != 0)) goto LAB_0010854d;
        *(char *)((long)local_80 + uVar11) = (char)local_90;
        uVar11 = uVar11 + 1;
        iVar4 = iVar4 + ctl->eaten;
        ctl->eaten = iVar4;
      } while ((int)uVar11 != 0x200);
      uVar11 = 0x200;
LAB_0010854d:
      uVar11 = uVar11 & 0xffffffff;
      goto LAB_00107fe9;
    case 0xc4:
      local_78 = puVar17;
      iVar4 = getNum(local_68 + iVar4,puVar17,ctl->opt + 1);
      lVar13 = (long)iVar4 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar4 = getNum(pcVar15 + lVar13,val,ctl->opt + 2);
      lVar13 = (long)iVar4 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar4 = getNum(pcVar15 + lVar13,&local_90,(int8_t *)&local_9c);
      lVar13 = (long)iVar4 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar4 = getNum(pcVar15 + lVar13,&local_58,(int8_t *)&local_94);
      lVar13 = (long)iVar4 + (long)ctl->eaten;
      ctl->eaten = (int)lVar13;
      iVar4 = getNum(pcVar15 + lVar13,&local_60,&local_95);
      ctl->eaten = ctl->eaten + iVar4;
      if (ctl->opt[1] != '\x01') {
        return -2;
      }
      if ((*local_78 & 0x80000000) != 0) {
        return -2;
      }
      if (ctl->opt[2] != '\x01') {
        return -2;
      }
      if ((int)*local_88 < 1) {
        return -2;
      }
      if ((char)local_9c != '\x01') {
        return -2;
      }
      if ((char)local_94 != '\x01') {
        return -2;
      }
      if (local_95 != '\x01') {
        return -2;
      }
      *local_80 = (int)local_90;
      local_80[1] = (int)local_58;
      local_80[2] = (int)local_60;
      iVar4 = ctl->eaten;
      uVar16 = 0xc;
      do {
        iVar4 = getNum(local_68 + iVar4,&local_90,(int8_t *)&local_9c);
        if (((char)local_9c != '\x01') || ((local_90 & 0xffffff00) != 0)) {
          p[3] = uVar16;
          if ((int)uVar16 != 0xc) {
            return iVar3;
          }
          return -2;
        }
        *(char *)((long)local_80 + uVar16) = (char)local_90;
        iVar4 = iVar4 + ctl->eaten;
        ctl->eaten = iVar4;
        uVar16 = uVar16 + 1;
      } while ((int)uVar16 != 0x20c);
      p[3] = 0x20c;
      break;
    case 0xc5:
      uVar16 = 0;
      do {
        iVar4 = getNum(local_68 + (int)uVar11,&local_90,(int8_t *)&local_9c);
        if (((char)local_9c != '\x01') || ((local_90 & 0xffffff00) != 0)) goto LAB_001088c8;
        *(char *)((long)local_80 + uVar16) = (char)local_90;
        uVar10 = iVar4 + ctl->eaten;
        uVar11 = (ulong)uVar10;
        ctl->eaten = uVar10;
        uVar16 = uVar16 + 1;
      } while ((int)uVar16 != 0x200);
LAB_001088be:
      p[3] = 0x200;
      break;
    default:
      return -2;
    }
  }
  return iVar3;
}

Assistant:

int cmdParse(
   char *buf, uintptr_t *p, unsigned ext_len, char *ext, cmdCtlParse_t *ctl)
{
   int f, valid, idx, val, pp, pars, n, n2;
   char *p8;
   int32_t *p32;
   char c;
   uintptr_t tp1=0, tp2=0, tp3=0, tp4=0, tp5=0;
   int8_t to1, to2, to3, to4, to5;
   int eaten;

   /* Check that ext is big enough for the largest message. */
   if (ext_len < (4 * CMD_MAX_PARAM)) return CMD_EXT_TOO_SMALL;

   bzero(&ctl->opt, sizeof(ctl->opt));

   sscanf(buf+ctl->eaten, " %31s %n", intCmdStr, &pp);

   ctl->eaten += pp;

   p[0] = -1;

   idx = cmdMatch(intCmdStr);

   intCmdIdx = idx;

   if (idx < 0) return idx;

   valid = 0;

   p[0] = cmdInfo[idx].cmd;
   p[1] = 0;
   p[2] = 0;
   p[3] = 0;

   switch (cmdInfo[idx].vt)
   {
      case 101: /* BR1  BR2  CGI  H  HELP  HWVER
                   DCRA  HALT  INRA  NO
                   PIGPV  POPA  PUSHA  RET  T  TICK  WVBSY  WVCLR
                   WVCRE  WVGO  WVGOR  WVHLT  WVNEW

                   No parameters, always valid.
                */
         valid = 1;

         break;

      case 111: /* ADD  AND  BC1  BC2  BS1  BS2  
                   CMP  CSI  DIV  LDA  LDAB  MLT
                   MOD  OR  RLA  RRA  STAB  SUB  WAIT  XOR

                   One parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] > 0) valid = 1;

         break;

      case 112: /* BI2CC FC  GDC  GPW  I2CC  I2CRB
                   MG  MICS  MILS  MODEG  NC  NP  PADG PFG  PRG
                   PROCD  PROCP  PROCS  PRRG  R  READ  SLRC  SPIC
                   WVDEL  WVSC  WVSM  WVSP  WVTX  WVTXR  BSPIC

                   One positive parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)) valid = 1;

         break;

      case 113: /* DCR  INR  POP  PUSH  STA  XA

                   One register parameter.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 114: /* CALL  JM  JMP  JNZ  JP  JZ  TAG

                   One numeric parameter, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         if (ctl->opt[1] == CMD_NUMERIC) valid = 1;

         break;

      case 115: /* PARSE  PROC

                   One parameter, string (rest of input).
                */
         p[3] = strlen(buf+ctl->eaten);
         memcpy(ext, buf+ctl->eaten, p[3]);
         ctl->eaten += p[3];
         valid = 1;

         break;

      case 116: /* SYS

                   One parameter, a string.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[3] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;
            valid = 1;
         }

         break;

      case 121: /* HC  FR  I2CRD  I2CRR  I2CRW  I2CWB I2CWQ  P
                   PADS  PFS  PRS  PWM  S  SERVO  SLR  SLRI  W
                   WDOG  WRITE  WVTXM

                   Two positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0)) valid = 1;

         break;

      case 122: /* NB

                   Two parameters, first positive, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 123: /* LD  RL  RR

                   Two parameters, first register, second any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) &&
             (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0)) valid = 1;

         break;

      case 124: /* X

                   Two register parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] > 0) && (p[1] < PI_MAX_SCRIPT_VARS) &&
             (ctl->opt[2] > 0) && (p[2] < PI_MAX_SCRIPT_VARS)) valid = 1;

         break;

      case 125: /* M MODES

                   Two parameters, first positive, second in 'RW540123'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtMdeStr, val);

            if (p8 != NULL)
            {
               val = p8 - fmtMdeStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 126: /* PUD

                   Two parameters, first positive, second in 'ODU'.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         f = sscanf(buf+ctl->eaten, " %c %n", &c, &n);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0)  && (f >= 1))
         {
            ctl->eaten += n;
            val = toupper(c);
            p8 = strchr(fmtPudStr, val);
            if (p8 != NULL)
            {
               val = p8 - fmtPudStr;
               p[2] = val;
               valid = 1;
            }
         }

         break;

      case 127: /* FL  FO

                   Two parameters, first a string, other positive.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0))
               valid = 1;
         }

         break;

      case 128: /* SHELL

                   Two string parameters, the first space teminated.
                   The second arbitrary.
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);

         if ((f >= 0) && n)
         {
            valid = 1;

            p[1] = n;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n;
            ext[n] = 0; /* terminate first string */

            n2 = strlen(buf+ctl->eaten+1);
            memcpy(ext+n+1, buf+ctl->eaten+1, n2);
            ctl->eaten += n2;
            ctl->eaten ++;
            p[3] = p[1] + n2 + 1;
         }

         break;

      case 131: /* BI2CO  HP  I2CO  I2CPC  I2CRI  I2CWB  I2CWW
                   SLRO  SPIO  TRIG

                   Three positive parameters.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &ctl->opt[3]);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) && ((int)p[2] >= 0) &&
             (ctl->opt[3] > 0) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 132: /* SERO

                   Three parameters, first a string, rest >=0
                */
         f = sscanf(buf+ctl->eaten, " %*s%n %n", &n, &n2);
         if ((f >= 0) && n)
         {
            p[3] = n;
            ctl->opt[2] = CMD_NUMERIC;
            memcpy(ext, buf+ctl->eaten, n);
            ctl->eaten += n2;

            ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
            ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

            if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
                (ctl->opt[2] > 0) && ((int)p[2] >= 0))
               valid = 1;
         }

         break;

      case 133: /* FS

                   Three parameters.  First and third positive.
                   Second may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);

         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (ctl->opt[2] > 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0))
         {
            p[3] = 4;
            memcpy(ext, &tp1, 4);
            valid = 1;
         }

         break;

      case 134: /* BSPIO

                   Six parameters.  First to Fifth positive.
                   Sixth may be negative when interpreted as an int.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);
         ctl->eaten += getNum(buf+ctl->eaten, &tp4, &to4);
         ctl->eaten += getNum(buf+ctl->eaten, &tp5, &to5);
                                    
         if ((ctl->opt[1] > 0) && ((int)p[1] >= 0) &&
             (to1 == CMD_NUMERIC) && ((int)tp1 >= 0) &&
             (to2 == CMD_NUMERIC) && ((int)tp2 >= 0) &&
             (to3 == CMD_NUMERIC) && ((int)tp3 >= 0) &&
             (to4 == CMD_NUMERIC) && ((int)tp4 >= 0) &&
             (to5 == CMD_NUMERIC))
         {
            p[3] = 5 * 4;
            memcpy(ext+ 0, &tp1, 4);
            memcpy(ext+ 4, &tp2, 4);
            memcpy(ext+ 8, &tp3, 4);
            memcpy(ext+12, &tp4, 4);
            memcpy(ext+16, &tp5, 4);
            valid = 1;
         }

         break;

      case 191: /* PROCR PROCU

                   One to 11 parameters, first positive,
                   optional remainder, any value.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p32 = (int32_t *)ext;

            while (pars < PI_MAX_SCRIPT_PARAMS)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  pars++;
                  *p32++ = tp1;
               }
               else break;
            }

            p[3] = pars * 4;

            valid = 1;
         }

         break;

      case 192: /* WVAG

                   One or more triplets (gpios on, gpios off, delay),
                   any value.
                */

         pars = 0;
         p32 = (int32_t *)ext;

         while (pars < CMD_MAX_PARAM)
         {
            ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               pars++;
               *p32++ = tp1;
            }
            else break;
         }

         p[3] = pars * 4;

         if (pars && ((pars % 3) == 0)) valid = 1;

         break;

      case 193: /* BI2CZ  BSCX  BSPIX  FW  I2CWD  I2CZ  SERW
		   SPIW  SPIX

                   Two or more parameters, first >=0, rest 0-255.

		   BSCX is special case one or more.
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0))
         {
            pars = 0;
            p8 = ext;

            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars || (p[0]==PI_CMD_BSCX)) valid = 1;
         }

         break;

      case 194: /* I2CPK  I2CWI  I2CWK

                   Three to 34 parameters, all 0-255.
                */

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

         if ((ctl->opt[1] == CMD_NUMERIC) &&
             (ctl->opt[2] == CMD_NUMERIC) &&
             ((int)p[1]>=0) && ((int)p[2]>=0) && ((int)p[2]<=255))
         {
            pars = 0;
            p8 = ext;

            while (pars < 32)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     pars++;
                     *p8++ = tp1;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars;

            if (pars > 0) valid = 1;
         }

         break;

      case 195: /* CF1  CF2

                   Zero or more parameters, first two >=0, rest 0-255.
                */
         valid = 1;

         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);

         if (ctl->opt[1] == CMD_NUMERIC)
         {
            if ((int)p[1] >= 0)
            {
               ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);

               if (ctl->opt[2] == CMD_NUMERIC)
               {
                  if ((int)p[2] >= 0)
                  {
                     pars = 0;
                     p8 = ext;

                     while (pars < CMD_MAX_PARAM)
                     {
                        eaten = getNum(buf+ctl->eaten, &tp1, &to1);
                        if (to1 == CMD_NUMERIC)
                        {
                           if (((int)tp1>=0) && ((int)tp1<=255))
                           {
                              pars++;
                              *p8++ = tp1;
                              ctl->eaten += eaten;
                           }
                           else break;
                        }
                        else break;
                     }

                     p[3] = pars;
                  }
                  else valid = 0;
               }
            }
            else valid = 0;
         }

         break;

      case 196: /* WVAS

                   gpio baud offset char...

                   p1 gpio
                   p2 baud
                   p3 len + 4
                   ---------
                   uint32_t databits
                   uint32_t stophalfbits
                   uint32_t offset
                   uint8_t[len]
                */
         ctl->eaten += getNum(buf+ctl->eaten, &p[1], &ctl->opt[1]);
         ctl->eaten += getNum(buf+ctl->eaten, &p[2], &ctl->opt[2]);
         ctl->eaten += getNum(buf+ctl->eaten, &tp1, &to1);
         ctl->eaten += getNum(buf+ctl->eaten, &tp2, &to2);
         ctl->eaten += getNum(buf+ctl->eaten, &tp3, &to3);

         if ((ctl->opt[1] == CMD_NUMERIC) && ((int)p[1] >= 0) &&
             (ctl->opt[2] == CMD_NUMERIC) && ((int)p[2] > 0) &&
             (to1 == CMD_NUMERIC) &&
             (to2 == CMD_NUMERIC) &&
             (to3 == CMD_NUMERIC))
         {
            pars = 0;

            memcpy(ext, &tp1, 4);
            memcpy(ext+4, &tp2, 4);
            memcpy(ext+8, &tp3, 4);
            p8 = ext + 12;
            while (pars < CMD_MAX_PARAM)
            {
               eaten = getNum(buf+ctl->eaten, &tp1, &to1);
               if (to1 == CMD_NUMERIC)
               {
                  if (((int)tp1>=0) && ((int)tp1<=255))
                  {
                     *p8++ = tp1;
                     pars++;
                     ctl->eaten += eaten;
                  }
                  else break; /* invalid number, end of command */
               }
               else break;
            }

            p[3] = pars + 12;

            if (pars > 0) valid = 1;
         }

         break;

      case 197: /* WVCHA

                   One or more parameters, all 0-255.
                */
         pars = 0;
         p8 = ext;

         while (pars < CMD_MAX_PARAM)
         {
            eaten = getNum(buf+ctl->eaten, &tp1, &to1);
            if (to1 == CMD_NUMERIC)
            {
               if (((int)tp1>=0) && ((int)tp1<=255))
               {
                  pars++;
                  *p8++ = tp1;
                  ctl->eaten += eaten;
               }
               else break; /* invalid number, end of command */
            }
            else break;
         }

         p[3] = pars;

         if (pars) valid = 1;

         break;


   }

   if (valid) return idx; else return CMD_BAD_PARAMETER;
}